

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O1

int SUNLinSolSpace_SPFGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long lVar1;
  N_Vector v;
  long lVar2;
  sunindextype lrw1;
  sunindextype liw1;
  sunindextype local_28;
  sunindextype local_20;
  
  lVar2 = (long)*S->content;
  v = *(N_Vector *)((long)S->content + 0x90);
  if (v->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    local_20 = 0;
    local_28 = 0;
  }
  else {
    N_VSpace(v,&local_28,&local_20);
  }
  lVar1 = lVar2 * 2 + 4;
  *lenrwLS = local_28 * lVar1 + (lVar2 + 5) * lVar2 + 2;
  *leniwLS = lVar1 * local_20;
  return 0;
}

Assistant:

int SUNLinSolSpace_SPFGMR(SUNLinearSolver S, 
                          long int *lenrwLS, 
                          long int *leniwLS)
{
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPFGMR_CONTENT(S)->maxl;
  if (SPFGMR_CONTENT(S)->vtemp->ops->nvspace)
    N_VSpace(SPFGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*(2*maxl + 4) + maxl*(maxl + 5) + 2;
  *leniwLS = liw1*(2*maxl + 4);
  return(SUNLS_SUCCESS);
}